

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GenerateSerializeWithCachedSizesToArray
          (MapFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  Type TVar2;
  Descriptor *pDVar3;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  allocator local_89;
  Formatter format;
  string local_50;
  
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  Formatter::operator()<>(&format,"if (!this->_internal_$name$().empty()) {\n");
  io::Printer::Indent(format.printer_);
  pDVar3 = FieldDescriptor::message_type((this->super_FieldGenerator).descriptor_);
  std::__cxx11::string::string((string *)&local_50,"key",&local_89);
  this_00 = Descriptor::FindFieldByName(pDVar3,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pDVar3 = FieldDescriptor::message_type((this->super_FieldGenerator).descriptor_);
  std::__cxx11::string::string((string *)&local_50,"value",&local_89);
  this_01 = Descriptor::FindFieldByName(pDVar3,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  TVar1 = FieldDescriptor::type(this_00);
  TVar2 = FieldDescriptor::type(this_01);
  Formatter::operator()<>
            (&format,
             "typedef ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_pointer\n    ConstPtr;\n");
  if (TVar1 == TYPE_STRING) {
    Formatter::operator()<>
              (&format,
               "typedef ConstPtr SortItem;\ntypedef ::$proto_ns$::internal::CompareByDerefFirst<SortItem> Less;\n"
              );
  }
  else {
    Formatter::operator()<>
              (&format,
               "typedef ::$proto_ns$::internal::SortItem< $key_cpp$, ConstPtr > SortItem;\ntypedef ::$proto_ns$::internal::CompareByFirstField<SortItem> Less;\n"
              );
    if (TVar2 != TYPE_STRING) goto LAB_00309406;
  }
  Formatter::operator()<>
            (&format,"struct Utf8Check {\n  static void Check(ConstPtr p) {\n    (void)p;\n");
  io::Printer::Indent(format.printer_);
  io::Printer::Indent(format.printer_);
  if (TVar1 == TYPE_STRING) {
    GenerateUtf8CheckCodeForString
              (this_00,(this->super_FieldGenerator).options_,false,
               "p->first.data(), static_cast<int>(p->first.length()),\n",&format);
  }
  if (TVar2 == TYPE_STRING) {
    GenerateUtf8CheckCodeForString
              (this_01,(this->super_FieldGenerator).options_,false,
               "p->second.data(), static_cast<int>(p->second.length()),\n",&format);
  }
  io::Printer::Outdent(format.printer_);
  io::Printer::Outdent(format.printer_);
  Formatter::operator()<>(&format,"  }\n};\n");
LAB_00309406:
  Formatter::operator()<>
            (&format,
             "\nif (stream->IsSerializationDeterministic() &&\n    this->_internal_$name$().size() > 1) {\n  ::std::unique_ptr<SortItem[]> items(\n      new SortItem[this->_internal_$name$().size()]);\n  typedef ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::size_type size_type;\n  size_type n = 0;\n  for (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n      it = this->_internal_$name$().begin();\n      it != this->_internal_$name$().end(); ++it, ++n) {\n    items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);\n  }\n  ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());\n"
            );
  io::Printer::Indent(format.printer_);
  GenerateSerializationLoop(&format,TVar1 == TYPE_STRING,TVar2 == TYPE_STRING,true);
  io::Printer::Outdent(format.printer_);
  Formatter::operator()<>(&format,"} else {\n");
  io::Printer::Indent(format.printer_);
  GenerateSerializationLoop(&format,TVar1 == TYPE_STRING,TVar2 == TYPE_STRING,false);
  io::Printer::Outdent(format.printer_);
  Formatter::operator()<>(&format,"}\n");
  io::Printer::Outdent(format.printer_);
  Formatter::operator()<>(&format,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void MapFieldGenerator::GenerateSerializeWithCachedSizesToArray(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format("if (!this->_internal_$name$().empty()) {\n");
  format.Indent();
  const FieldDescriptor* key_field =
      descriptor_->message_type()->FindFieldByName("key");
  const FieldDescriptor* value_field =
      descriptor_->message_type()->FindFieldByName("value");
  const bool string_key = key_field->type() == FieldDescriptor::TYPE_STRING;
  const bool string_value = value_field->type() == FieldDescriptor::TYPE_STRING;

  format(
      "typedef ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_pointer\n"
      "    ConstPtr;\n");
  if (string_key) {
    format(
        "typedef ConstPtr SortItem;\n"
        "typedef ::$proto_ns$::internal::"
        "CompareByDerefFirst<SortItem> Less;\n");
  } else {
    format(
        "typedef ::$proto_ns$::internal::SortItem< $key_cpp$, ConstPtr > "
        "SortItem;\n"
        "typedef ::$proto_ns$::internal::CompareByFirstField<SortItem> "
        "Less;\n");
  }
  bool utf8_check = string_key || string_value;
  if (utf8_check) {
    format(
        "struct Utf8Check {\n"
        "  static void Check(ConstPtr p) {\n"
        // p may be unused when GetUtf8CheckMode evaluates to kNone,
        // thus disabling the validation.
        "    (void)p;\n");
    format.Indent();
    format.Indent();
    if (string_key) {
      GenerateUtf8CheckCodeForString(
          key_field, options_, false,
          "p->first.data(), static_cast<int>(p->first.length()),\n", format);
    }
    if (string_value) {
      GenerateUtf8CheckCodeForString(
          value_field, options_, false,
          "p->second.data(), static_cast<int>(p->second.length()),\n", format);
    }
    format.Outdent();
    format.Outdent();
    format(
        "  }\n"
        "};\n");
  }

  format(
      "\n"
      "if (stream->IsSerializationDeterministic() &&\n"
      "    this->_internal_$name$().size() > 1) {\n"
      "  ::std::unique_ptr<SortItem[]> items(\n"
      "      new SortItem[this->_internal_$name$().size()]);\n"
      "  typedef ::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::size_type "
      "size_type;\n"
      "  size_type n = 0;\n"
      "  for (::$proto_ns$::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
      "      it = this->_internal_$name$().begin();\n"
      "      it != this->_internal_$name$().end(); ++it, ++n) {\n"
      "    items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);\n"
      "  }\n"
      "  ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());\n");
  format.Indent();
  GenerateSerializationLoop(format, string_key, string_value, true);
  format.Outdent();
  format("} else {\n");
  format.Indent();
  GenerateSerializationLoop(format, string_key, string_value, false);
  format.Outdent();
  format("}\n");
  format.Outdent();
  format("}\n");
}